

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
ElementsTransactionApi_FundRawTransaction_MinBits36_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_MinBits36_Test *this)

{
  long *plVar1;
  undefined1 **ppuVar2;
  pointer pTVar3;
  bool bVar4;
  uint32_t uVar5;
  pointer hex;
  ulong uVar6;
  char *pcVar7;
  pointer pCVar8;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  ConfidentialTransactionContext context;
  UtxoFilter filter;
  ElementsAddressFactory factory;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  string descMulti;
  ExtPubkey key;
  ConfidentialAssetId fee_asset;
  CoinSelectionOption option;
  ElementsConfidentialAddress ct_addr1;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ElementsConfidentialAddress reserve_ct_addr1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ElementsConfidentialAddress ct_addr2;
  ElementsConfidentialAddress reserve_ct_addr2;
  ConfidentialTransactionController ctx;
  ElementsConfidentialAddress ct_addr3;
  ConfidentialTransactionContext tx;
  ElementsConfidentialAddress ct_addr4;
  Address addr2;
  Address addr1;
  Address set_addr4;
  Address set_addr3;
  Address set_addr2;
  Address set_addr1;
  Txid local_1818;
  undefined1 local_17f8 [47];
  ElementsTransactionApi local_17c9;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_17c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17a8;
  string local_1788;
  undefined1 local_1768 [184];
  pointer local_16b0;
  UtxoFilter local_16a4;
  AddressFactory local_16a0;
  string local_1678;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  local_1658;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  local_1638;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_1618;
  undefined1 *local_1600 [2];
  undefined1 local_15f0 [16];
  ExtPubkey local_15e0;
  ConfidentialAssetId local_1570;
  CoinSelectionOption local_1548;
  undefined1 local_14e0 [16];
  _func_int *local_14d0 [6];
  pointer local_14a0;
  pointer local_1488;
  Privkey local_1330;
  Pubkey local_1310;
  Amount local_12f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_12e8;
  ElementsConfidentialAddress local_12b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1108;
  undefined1 local_10d8 [64];
  pointer local_1098;
  pointer local_1080;
  SigHashType local_f24;
  ElementsConfidentialAddress local_f18;
  ConfidentialTransactionController local_d68;
  ElementsConfidentialAddress local_d18;
  ConfidentialTransactionContext local_b68;
  ElementsConfidentialAddress local_ab0;
  Address local_900;
  Address local_788;
  Address local_610;
  Address local_498;
  Address local_320;
  Address local_1a8;
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_b68,2,0);
  local_17c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_17c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_16a0,kElementsRegtest);
  local_1600[0] = local_15f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1600,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,"");
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (&local_17c8,
             ((long)kFundCoinSelectElementsTestVector2.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)kFundCoinSelectElementsTestVector2.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  pTVar3 = kFundCoinSelectElementsTestVector2.
           super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (kFundCoinSelectElementsTestVector2.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      kFundCoinSelectElementsTestVector2.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
    hex = kFundCoinSelectElementsTestVector2.
          super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid((Txid *)local_10d8);
      if ((hex->txid)._M_string_length != 0) {
        cfd::core::Txid::Txid((Txid *)local_14e0,&hex->txid);
        cfd::core::Txid::operator=((Txid *)local_10d8,(Txid *)local_14e0);
        local_14e0._0_8_ = &PTR__Txid_00735400;
        if ((void *)CONCAT71(local_14e0._9_7_,local_14e0[8]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_14e0._9_7_,local_14e0[8]));
        }
      }
      cfd::core::Txid::Txid((Txid *)local_14e0,&hex->txid);
      cfd::core::Txid::operator=
                (&local_17c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar6].txid,(Txid *)local_14e0);
      local_14e0._0_8_ = &PTR__Txid_00735400;
      if ((void *)CONCAT71(local_14e0._9_7_,local_14e0[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_14e0._9_7_,local_14e0[8]));
      }
      local_17c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6].vout = hex->vout;
      cfd::core::Amount::Amount((Amount *)local_14e0,hex->amount);
      local_17c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6].amount.ignore_check_ = (bool)local_14e0[8];
      local_17c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6].amount.amount_ = local_14e0._0_8_;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_14e0,&hex->asset);
      cfd::core::ConfidentialAssetId::operator=
                (&local_17c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar6].asset,
                 (ConfidentialAssetId *)local_14e0);
      local_14e0._0_8_ = &PTR__ConfidentialAssetId_00735710;
      if ((void *)CONCAT71(local_14e0._9_7_,local_14e0[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_14e0._9_7_,local_14e0[8]));
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 &local_17c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar6].descriptor);
      local_17c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6].address_type = kP2shP2wpkhAddress;
      local_10d8._0_8_ = &PTR__Txid_00735400;
      if ((pointer)local_10d8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_10d8._8_8_);
      }
      hex = hex + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (hex != pTVar3);
  }
  local_14e0._0_8_ = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14e0,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,"");
  cfd::core::ExtPubkey::ExtPubkey(&local_15e0,(string *)local_14e0);
  if ((_func_int **)local_14e0._0_8_ != local_14d0) {
    operator_delete((void *)local_14e0._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_14e0,&local_15e0,0xb);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_10d8,(ExtPubkey *)local_14e0);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_1a8,&local_16a0,(Pubkey *)local_10d8);
  if ((_func_int **)local_10d8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_10d8._0_8_);
  }
  if (local_1488 != (pointer)0x0) {
    operator_delete(local_1488);
  }
  if (local_14a0 != (pointer)0x0) {
    operator_delete(local_14a0);
  }
  if (local_14d0[3] != (_func_int *)0x0) {
    operator_delete(local_14d0[3]);
  }
  if ((_func_int **)local_14e0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14e0._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_14e0,&local_15e0,0xc);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_10d8,(ExtPubkey *)local_14e0);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_320,&local_16a0,(Pubkey *)local_10d8);
  if ((_func_int **)local_10d8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_10d8._0_8_);
  }
  if (local_1488 != (pointer)0x0) {
    operator_delete(local_1488);
  }
  if (local_14a0 != (pointer)0x0) {
    operator_delete(local_14a0);
  }
  if (local_14d0[3] != (_func_int *)0x0) {
    operator_delete(local_14d0[3]);
  }
  if ((_func_int **)local_14e0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14e0._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_14e0,&local_15e0,0xd);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_10d8,(ExtPubkey *)local_14e0);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_498,&local_16a0,(Pubkey *)local_10d8);
  if ((_func_int **)local_10d8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_10d8._0_8_);
  }
  if (local_1488 != (pointer)0x0) {
    operator_delete(local_1488);
  }
  if (local_14a0 != (pointer)0x0) {
    operator_delete(local_14a0);
  }
  if (local_14d0[3] != (_func_int *)0x0) {
    operator_delete(local_14d0[3]);
  }
  if ((_func_int **)local_14e0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14e0._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_14e0,&local_15e0,0xe);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_10d8,(ExtPubkey *)local_14e0);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_610,&local_16a0,(Pubkey *)local_10d8);
  if ((_func_int **)local_10d8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_10d8._0_8_);
  }
  if (local_1488 != (pointer)0x0) {
    operator_delete(local_1488);
  }
  if (local_14a0 != (pointer)0x0) {
    operator_delete(local_14a0);
  }
  if (local_14d0[3] != (_func_int *)0x0) {
    operator_delete(local_14d0[3]);
  }
  if ((_func_int **)local_14e0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14e0._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_10d8,&local_15e0,0x6f);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_d18,(ExtPubkey *)local_10d8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_14e0,&local_1a8,(ConfidentialKey *)&local_d18);
  if ((pointer)local_d18.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d18.unblinded_address_._0_8_);
  }
  if (local_1080 != (pointer)0x0) {
    operator_delete(local_1080);
  }
  if (local_1098 != (pointer)0x0) {
    operator_delete(local_1098);
  }
  if ((pointer)local_10d8._40_8_ != (pointer)0x0) {
    operator_delete((void *)local_10d8._40_8_);
  }
  if ((_func_int **)local_10d8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_10d8._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_d18,&local_15e0,0x70);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_ab0,(ExtPubkey *)&local_d18);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_10d8,&local_320,(ConfidentialKey *)&local_ab0);
  if ((pointer)local_ab0.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_ab0.unblinded_address_._0_8_);
  }
  if (local_d18.unblinded_address_.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_d18.unblinded_address_.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_d18.unblinded_address_.hash_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_d18.unblinded_address_.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((pointer)local_d18.unblinded_address_.address_.field_2._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_d18.unblinded_address_.address_.field_2._8_8_);
  }
  if ((pointer)local_d18.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d18.unblinded_address_._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_ab0,&local_15e0,0x71);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_12b8,(ExtPubkey *)&local_ab0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_d18,&local_498,(ConfidentialKey *)&local_12b8);
  if ((undefined1 **)local_12b8.unblinded_address_._0_8_ != (undefined1 **)0x0) {
    operator_delete((void *)local_12b8.unblinded_address_._0_8_);
  }
  if (local_ab0.unblinded_address_.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_ab0.unblinded_address_.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_ab0.unblinded_address_.hash_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_ab0.unblinded_address_.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((pointer)local_ab0.unblinded_address_.address_.field_2._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_ab0.unblinded_address_.address_.field_2._8_8_);
  }
  if ((pointer)local_ab0.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_ab0.unblinded_address_._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_12b8,&local_15e0,0x72);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_f18,(ExtPubkey *)&local_12b8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_ab0,&local_610,(ConfidentialKey *)&local_f18);
  if ((undefined1 **)local_f18.unblinded_address_._0_8_ != (undefined1 **)0x0) {
    operator_delete((void *)local_f18.unblinded_address_._0_8_);
  }
  if (local_12b8.unblinded_address_.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_12b8.unblinded_address_.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_12b8.unblinded_address_.hash_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_12b8.unblinded_address_.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((pointer)local_12b8.unblinded_address_.address_.field_2._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_12b8.unblinded_address_.address_.field_2._8_8_);
  }
  if ((undefined1 **)local_12b8.unblinded_address_._0_8_ != (undefined1 **)0x0) {
    operator_delete((void *)local_12b8.unblinded_address_._0_8_);
  }
  cfd::core::Amount::Amount((Amount *)&local_12b8,300000000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_b68,(ElementsConfidentialAddress *)local_14e0,(Amount *)&local_12b8,
             &exp_dummy_asset_a,false);
  cfd::core::Amount::Amount((Amount *)&local_12b8,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_b68,(ElementsConfidentialAddress *)local_10d8,(Amount *)&local_12b8,
             &exp_dummy_asset_b,false);
  cfd::core::Amount::Amount((Amount *)&local_12b8,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_b68,&local_d18,(Amount *)&local_12b8,&exp_dummy_asset_a,false);
  cfd::core::Amount::Amount((Amount *)&local_12b8,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_b68,&local_ab0,(Amount *)&local_12b8,&exp_dummy_asset_a,false);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1570,&exp_dummy_asset_a);
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_12e8._M_impl.super__Rb_tree_header._M_header;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_12e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_12e8._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_12b8,&exp_dummy_asset_a);
  cfd::core::Amount::Amount((Amount *)&local_f18,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_12e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_12b8,
             (Amount *)&local_f18);
  ppuVar2 = (undefined1 **)((long)&local_12b8 + 0x10);
  if ((undefined1 **)local_12b8.unblinded_address_._0_8_ != ppuVar2) {
    operator_delete((void *)local_12b8.unblinded_address_._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_12b8,&exp_dummy_asset_b);
  cfd::core::Amount::Amount((Amount *)&local_f18,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_12e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_12b8,
             (Amount *)&local_f18);
  if ((undefined1 **)local_12b8.unblinded_address_._0_8_ != ppuVar2) {
    operator_delete((void *)local_12b8.unblinded_address_._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_12b8,&local_15e0,1);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_f18,(ExtPubkey *)&local_12b8);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_788,&local_16a0,(Pubkey *)&local_f18);
  if ((undefined1 **)local_f18.unblinded_address_._0_8_ != (undefined1 **)0x0) {
    operator_delete((void *)local_f18.unblinded_address_._0_8_);
  }
  if (local_12b8.unblinded_address_.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_12b8.unblinded_address_.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_12b8.unblinded_address_.hash_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_12b8.unblinded_address_.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((pointer)local_12b8.unblinded_address_.address_.field_2._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_12b8.unblinded_address_.address_.field_2._8_8_);
  }
  if ((undefined1 **)local_12b8.unblinded_address_._0_8_ != (undefined1 **)0x0) {
    operator_delete((void *)local_12b8.unblinded_address_._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_12b8,&local_15e0,2);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_f18,(ExtPubkey *)&local_12b8);
  cfd::AddressFactory::CreateP2wpkhAddress(&local_900,&local_16a0,(Pubkey *)&local_f18);
  if ((undefined1 **)local_f18.unblinded_address_._0_8_ != (undefined1 **)0x0) {
    operator_delete((void *)local_f18.unblinded_address_._0_8_);
  }
  if (local_12b8.unblinded_address_.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_12b8.unblinded_address_.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_12b8.unblinded_address_.hash_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_12b8.unblinded_address_.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((pointer)local_12b8.unblinded_address_.address_.field_2._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_12b8.unblinded_address_.address_.field_2._8_8_);
  }
  if ((undefined1 **)local_12b8.unblinded_address_._0_8_ != (undefined1 **)0x0) {
    operator_delete((void *)local_12b8.unblinded_address_._0_8_);
  }
  local_1108._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1108._M_impl.super__Rb_tree_header._M_header;
  local_1108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1108._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1108._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1108._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_12b8,&exp_dummy_asset_a);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_f18,&local_788);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_1108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_12b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f18);
  if ((undefined1 **)local_f18.unblinded_address_._0_8_ != (undefined1 **)((long)&local_f18 + 0x10U)
     ) {
    operator_delete((void *)local_f18.unblinded_address_._0_8_);
  }
  if ((undefined1 **)local_12b8.unblinded_address_._0_8_ != ppuVar2) {
    operator_delete((void *)local_12b8.unblinded_address_._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_12b8,&exp_dummy_asset_b);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_f18,&local_900);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_1108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_12b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f18);
  if ((undefined1 **)local_f18.unblinded_address_._0_8_ != (undefined1 **)((long)&local_f18 + 0x10U)
     ) {
    operator_delete((void *)local_f18.unblinded_address_._0_8_);
  }
  if ((undefined1 **)local_12b8.unblinded_address_._0_8_ != ppuVar2) {
    operator_delete((void *)local_12b8.unblinded_address_._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_f18,&local_15e0,0x5b);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_1768,(ExtPubkey *)&local_f18);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_12b8,&local_788,(ConfidentialKey *)local_1768);
  if ((long *)local_1768._0_8_ != (long *)0x0) {
    operator_delete((void *)local_1768._0_8_);
  }
  if (local_f18.unblinded_address_.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_f18.unblinded_address_.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_f18.unblinded_address_.hash_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_f18.unblinded_address_.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((pointer)local_f18.unblinded_address_.address_.field_2._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_f18.unblinded_address_.address_.field_2._8_8_);
  }
  if ((undefined1 **)local_f18.unblinded_address_._0_8_ != (undefined1 **)0x0) {
    operator_delete((void *)local_f18.unblinded_address_._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_1768,&local_15e0,0x5c);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_1548,(ExtPubkey *)local_1768);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_f18,&local_900,(ConfidentialKey *)&local_1548);
  if ((pointer)local_1548._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1548._0_8_);
  }
  if ((pointer)local_1768._88_8_ != (pointer)0x0) {
    operator_delete((void *)local_1768._88_8_);
  }
  if ((pointer)local_1768._64_8_ != (pointer)0x0) {
    operator_delete((void *)local_1768._64_8_);
  }
  if ((pointer)local_1768._40_8_ != (pointer)0x0) {
    operator_delete((void *)local_1768._40_8_);
  }
  if ((long *)local_1768._0_8_ != (long *)0x0) {
    operator_delete((void *)local_1768._0_8_);
  }
  local_1638.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1638.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1638.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&local_12f8);
  local_17a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_17a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&local_1548);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&local_1548);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&local_1548,0.1);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&local_1548,0.1);
  cfd::CoinSelectionOption::SetFeeAsset(&local_1548,&local_1570);
  cfd::CoinSelectionOption::SetBlindInfo(&local_1548,0,0x24);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_1768,(AbstractTransaction *)&local_b68);
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (&local_d68,&local_17c9,(string *)local_1768,&local_17c8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
              *)&local_12e8,&local_1638,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_1108,&local_1570,true,0.1,&local_12f8,&local_16a4,&local_1548,&local_17a8,
             kCfdInvalidSettingError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  plVar1 = (long *)(local_1768 + 0x10);
  if ((long *)local_1768._0_8_ != plVar1) {
    operator_delete((void *)local_1768._0_8_);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_1768,&local_d68.super_AbstractTransactionController);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_17f8,"kExpTxData","ctx.GetHex().c_str()",
             "0200000000040a503dbd4f8f2b064c70e048b21f93fe4584174478abf5f44747932cd21da87c0000000000ffffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000ffffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000ffffffff020b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff070100000000000000000000000000000000000000000000000000000000000000aa01000110d9316ec00003b86ca86f23bc47e6ae1eebf2dea191f0ab98b89e2d5b6e5e8de20631441caeaa1600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb010000000ba43b740003a9dda6bdef90309c4fb5fe9131e396e9f9b32dc1b8defea451f71e6af1127b1d1600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b740003fef01583b95b37ee4f23d3673dfcc01faa4654272c289e8e3caa6aeb31f634741600144852255c0ff013e835689f30fb52508f89b6fbe20100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b7400037703a4ef463f044f462f35c4dece9d1f02d32681079c2c01cea4d6267dd782ef1600143159e9a1f6cdd588b6d5df65c3c7a190ecf0fba70100000000000000000000000000000000000000000000000000000000000000aa01000000000000026400000100000000000000000000000000000000000000000000000000000000000000bb01000000a2fb40580000160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa01000000fd340d189c0016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000"
             ,(char *)local_1768._0_8_);
  if ((long *)local_1768._0_8_ != plVar1) {
    operator_delete((void *)local_1768._0_8_);
  }
  if (local_17f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1768);
    if ((pointer)local_17f8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_17f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x326,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1818,(Message *)local_1768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1818);
    if ((long *)local_1768._0_8_ != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_1768._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_1768._0_8_ + 8))();
      }
      local_1768._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_17f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_1818._vptr_Txid = (_func_int **)CONCAT44(local_1818._vptr_Txid._4_4_,0x264);
  local_17f8._0_8_ = cfd::core::Amount::GetSatoshiValue(&local_12f8);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_1768,"612","estimate_fee.GetSatoshiValue()",(int *)&local_1818,
             (long *)local_17f8);
  if (local_1768[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_17f8);
    if ((pointer)local_1768._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_1768._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x327,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1818,(Message *)local_17f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1818);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17f8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_17f8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_17f8._0_8_ + 8))();
      }
      local_17f8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1768 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_17f8._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_1818._vptr_Txid =
       (_func_int **)
       ((long)local_17a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_17a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1768,"size_t{2}","append_txout_addresses.size()",
             (unsigned_long *)local_17f8,(unsigned_long *)&local_1818);
  if (local_1768[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_17f8);
    if ((pointer)local_1768._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_1768._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x328,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1818,(Message *)local_17f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1818);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17f8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_17f8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_17f8._0_8_ + 8))();
      }
      local_17f8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1768 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if ((long)local_17a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_17a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1768,&local_788);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_17f8,"addr1.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",(char *)local_1768._0_8_,
               local_17a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    if ((long *)local_1768._0_8_ != plVar1) {
      operator_delete((void *)local_1768._0_8_);
    }
    if (local_17f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1768);
      if ((pointer)local_17f8._8_8_ == (pointer)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_17f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1818,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x32b,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1818,(Message *)local_1768);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1818);
      if ((long *)local_1768._0_8_ != (long *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((long *)local_1768._0_8_ != (long *)0x0)) {
          (**(code **)(*(long *)local_1768._0_8_ + 8))();
        }
        local_1768._0_8_ = (long *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_17f8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1768,&local_900);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_17f8,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",(char *)local_1768._0_8_,
               ((local_17a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    if ((long *)local_1768._0_8_ != plVar1) {
      operator_delete((void *)local_1768._0_8_);
    }
    if (local_17f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1768);
      if ((pointer)local_17f8._8_8_ == (pointer)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_17f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1818,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x32c,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1818,(Message *)local_1768);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1818);
      if ((long *)local_1768._0_8_ != (long *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((long *)local_1768._0_8_ != (long *)0x0)) {
          (**(code **)(*(long *)local_1768._0_8_ + 8))();
        }
        local_1768._0_8_ = (long *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_17f8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_17f8,&local_d68.super_AbstractTransactionController);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1768,(string *)local_17f8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17f8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_17f8 + 0x10)
     ) {
    operator_delete((void *)local_17f8._0_8_);
  }
  local_1658.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1658.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1658.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1658,&local_12b8);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1658,&local_f18);
  cfd::ConfidentialTransactionContext::CollectInputUtxo
            ((ConfidentialTransactionContext *)local_1768,&local_17c8);
  cfd::ConfidentialTransactionContext::Blind
            ((ConfidentialTransactionContext *)local_1768,&local_1658,1,0,0x24,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
  cfd::core::ConfidentialTransaction::GetTxInList(&local_1618,(ConfidentialTransaction *)local_1768)
  ;
  local_16b0 = local_1618.
               super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1618.
      super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1618.
      super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pCVar8 = local_1618.
             super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid(&local_1818,&(pCVar8->super_AbstractTxInReference).txid_);
      cfd::core::OutPoint::OutPoint
                ((OutPoint *)local_17f8,&local_1818,(pCVar8->super_AbstractTxInReference).vout_);
      local_1788._M_dataplus._M_p = (pointer)&local_1788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1788,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_1310,&local_1788);
      local_1678._M_dataplus._M_p = (pointer)&local_1678.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1678,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_1330,&local_1678,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_f24);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_1768,(OutPoint *)local_17f8,&local_1310,
                 &local_1330,&local_f24,true);
      if (local_1330.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1330.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
        operator_delete(local_1678._M_dataplus._M_p);
      }
      if (local_1310.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1310.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1788._M_dataplus._M_p != &local_1788.field_2) {
        operator_delete(local_1788._M_dataplus._M_p);
      }
      local_17f8._0_8_ = &PTR__Txid_00735400;
      if ((pointer)local_17f8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_17f8._8_8_);
      }
      local_1818._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_1818.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1818.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pCVar8 = pCVar8 + 1;
    } while (pCVar8 != local_16b0);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector(&local_1618);
  uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1768);
  if (uVar5 != 0x17e6) {
    uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1768);
    if (uVar5 != 0x17e7) {
      uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1768);
      if (uVar5 != 0x17e8) {
        local_1818._vptr_Txid = (_func_int **)CONCAT44(local_1818._vptr_Txid._4_4_,100);
        uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1768);
        local_1788._M_dataplus._M_p._0_4_ = uVar5;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)local_17f8,"100","context.GetVsize()",(int *)&local_1818,
                   (uint *)&local_1788);
        if (local_17f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1818);
          if ((pointer)local_17f8._8_8_ == (pointer)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)local_17f8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1788,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                     ,0x33c,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1788,(Message *)&local_1818);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1788);
          if (local_1818._vptr_Txid != (_func_int **)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (local_1818._vptr_Txid != (_func_int **)0x0)) {
              (**(code **)(*local_1818._vptr_Txid + 8))();
            }
            local_1818._vptr_Txid = (_func_int **)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_17f8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&local_1658);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1768);
  local_d68.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_00735388;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_d68.transaction_);
  local_1548.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710
  ;
  if (local_1548.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1548.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_17a8);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&local_1638);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_f18);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_12b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_900.format_data_);
  cfd::core::Script::~Script(&local_900.redeem_script_);
  local_900.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_900.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_900.script_tree_.super_TapBranch);
  if (local_900.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_900.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_900.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_900.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_900.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_900.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.address_._M_dataplus._M_p != &local_900.address_.field_2) {
    operator_delete(local_900.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_788.format_data_);
  cfd::core::Script::~Script(&local_788.redeem_script_);
  local_788.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_788.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_788.script_tree_.super_TapBranch);
  if (local_788.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_788.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_788.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_788.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_788.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_788.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.address_._M_dataplus._M_p != &local_788.address_.field_2) {
    operator_delete(local_788.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_12e8);
  local_1570._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (local_1570.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1570.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_ab0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_d18);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_10d8);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_14e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_610.format_data_);
  cfd::core::Script::~Script(&local_610.redeem_script_);
  local_610.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_610.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_610.script_tree_.super_TapBranch);
  if (local_610.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_610.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_610.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_610.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_610.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_610.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.address_._M_dataplus._M_p != &local_610.address_.field_2) {
    operator_delete(local_610.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_498.format_data_);
  cfd::core::Script::~Script(&local_498.redeem_script_);
  local_498.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_498.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_498.script_tree_.super_TapBranch);
  if (local_498.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_498.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_498.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498.address_._M_dataplus._M_p != &local_498.address_.field_2) {
    operator_delete(local_498.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_320.format_data_);
  cfd::core::Script::~Script(&local_320.redeem_script_);
  local_320.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_320.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_320.script_tree_.super_TapBranch);
  if (local_320.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_320.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_320.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.address_._M_dataplus._M_p != &local_320.address_.field_2) {
    operator_delete(local_320.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1a8.format_data_);
  cfd::core::Script::~Script(&local_1a8.redeem_script_);
  local_1a8.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_1a8.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_1a8.script_tree_.super_TapBranch);
  if (local_1a8.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.address_._M_dataplus._M_p != &local_1a8.address_.field_2) {
    operator_delete(local_1a8.address_._M_dataplus._M_p);
  }
  if (local_15e0.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_15e0.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_15e0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_15e0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_15e0.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_15e0.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_15e0.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_15e0.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1600[0] != local_15f0) {
    operator_delete(local_1600[0]);
  }
  local_16a0._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_16a0.prefix_list_);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_17c8);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_b68);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_MinBits36) {
  static const char* const kExpTxData = "0200000000040a503dbd4f8f2b064c70e048b21f93fe4584174478abf5f44747932cd21da87c0000000000ffffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000ffffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000ffffffff020b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff070100000000000000000000000000000000000000000000000000000000000000aa01000110d9316ec00003b86ca86f23bc47e6ae1eebf2dea191f0ab98b89e2d5b6e5e8de20631441caeaa1600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb010000000ba43b740003a9dda6bdef90309c4fb5fe9131e396e9f9b32dc1b8defea451f71e6af1127b1d1600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b740003fef01583b95b37ee4f23d3673dfcc01faa4654272c289e8e3caa6aeb31f634741600144852255c0ff013e835689f30fb52508f89b6fbe20100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b7400037703a4ef463f044f462f35c4dece9d1f02d32681079c2c01cea4d6267dd782ef1600143159e9a1f6cdd588b6d5df65c3c7a190ecf0fba70100000000000000000000000000000000000000000000000000000000000000aa01000000000000026400000100000000000000000000000000000000000000000000000000000000000000bb01000000a2fb40580000160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa01000000fd340d189c0016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000";

  ConfidentialTransactionContext tx(uint32_t{2}, uint32_t{0});
  std::vector<UtxoData> utxos;
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  std::string descMulti = "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))";

  try {
    utxos.resize(kFundCoinSelectElementsTestVector2.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector2) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    // add txout
    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    Address set_addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(11).GetPubkey());
    Address set_addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(12).GetPubkey());
    Address set_addr3 = factory.CreateP2wpkhAddress(key.DerivePubkey(13).GetPubkey());
    Address set_addr4 = factory.CreateP2wpkhAddress(key.DerivePubkey(14).GetPubkey());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        set_addr1, key.DerivePubkey(111).GetPubkey());
    ElementsConfidentialAddress ct_addr2 = ElementsConfidentialAddress(
        set_addr2, key.DerivePubkey(112).GetPubkey());
    ElementsConfidentialAddress ct_addr3 = ElementsConfidentialAddress(
        set_addr3, key.DerivePubkey(113).GetPubkey());
    ElementsConfidentialAddress ct_addr4 = ElementsConfidentialAddress(
        set_addr4, key.DerivePubkey(114).GetPubkey());
    tx.AddTxOut(ct_addr1, Amount(int64_t{300000000000000}), exp_dummy_asset_a);
    tx.AddTxOut(ct_addr2, Amount(int64_t{50000000000}), exp_dummy_asset_b);
    tx.AddTxOut(ct_addr3, Amount(int64_t{50000000000}), exp_dummy_asset_a);
    tx.AddTxOut(ct_addr4, Amount(int64_t{50000000000}), exp_dummy_asset_a);

    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{0}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{0}));
    Address addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(1).GetPubkey());
    Address addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(2).GetPubkey());
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    double fee_rate = 0.1;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(fee_rate);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);

    EXPECT_STREQ(kExpTxData, ctx.GetHex().c_str());
    EXPECT_EQ(612, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{2}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{2})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[1].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet));
    }
    if ((context.GetVsize() != 6118) && (context.GetVsize() != 6119) && (context.GetVsize() != 6120)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}